

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O2

bool ccs::CcsContext::coerceString<bool>(string *s,bool *dest)

{
  __type _Var1;
  bool bVar2;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,"true",&local_41);
  _Var1 = std::operator==(s,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar2 = true;
  if (!_Var1) {
    std::__cxx11::string::string((string *)&local_40,"false",&local_41);
    _Var1 = std::operator==(s,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    bVar2 = false;
    if (!_Var1) {
      return false;
    }
  }
  *dest = bVar2;
  return true;
}

Assistant:

inline bool CcsContext::coerceString<bool>(const std::string &s,
    bool &dest) {
  // convert from a string to a bool: value must be exactly "true" or "false",
  // for maximum consistency with ccs boolean literals.
  if (s == std::string("true")) {
    dest = true;
    return true;
  }
  if (s == std::string("false")) {
    dest = false;
    return true;
  }
  return false;
}